

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  bool bVar1;
  ParenPragmaExpressionSyntax *pPVar2;
  SyntaxNode *pSVar3;
  Diagnostic *pDVar4;
  SimplePragmaExpressionSyntax *pSVar5;
  PragmaExpressionSyntax *pPVar6;
  SourceRange SVar7;
  string_view sVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  undefined1 local_c8 [8];
  string_view name;
  NameValuePragmaExpressionSyntax *nvp;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  SourceRange local_48;
  SmallVectorBase<slang::parsing::Token> *param_3_local;
  PragmaExpressionSyntax *args_local;
  Preprocessor *this_local;
  Token keyword_local;
  
  keyword_local._0_8_ = keyword.info;
  this_local = keyword._0_8_;
  if ((args != (PragmaExpressionSyntax *)0x0) &&
     ((args->super_SyntaxNode).kind == ParenPragmaExpression)) {
    pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                       (&args->super_SyntaxNode);
    bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                      (&pPVar2->values);
    if (!bVar1) {
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      join_0x00000010_0x00000000_ =
           slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                     (&pPVar2->values);
      _arg = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                       (&pPVar2->values);
      do {
        bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                              *)&__end2.index,
                             (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)&arg);
        if (!bVar1) {
          return;
        }
        pSVar3 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*
                            ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                             &__end2.index)->super_SyntaxNode;
        if (pSVar3->kind == NameValuePragmaExpression) {
          name._M_str = (char *)slang::syntax::SyntaxNode::
                                as<slang::syntax::NameValuePragmaExpressionSyntax>(pSVar3);
          sVar8 = Token::valueText(&((NameValuePragmaExpressionSyntax *)name._M_str)->name);
          _local_c8 = sVar8;
          bVar9 = sv("library",7);
          bVar1 = std::operator==(sVar8,bVar9);
          bVar9 = _local_c8;
          if (!bVar1) {
            bVar10 = sv("entry",5);
            bVar1 = std::operator==(bVar9,bVar10);
            bVar9 = _local_c8;
            if (!bVar1) {
              bVar10 = sv("feature",7);
              bVar1 = std::operator==(bVar9,bVar10);
              bVar9 = _local_c8;
              if (!bVar1) {
                bVar10 = sv("exit",4);
                bVar1 = std::operator==(bVar9,bVar10);
                bVar9 = _local_c8;
                if (!bVar1) {
                  bVar10 = sv("match",5);
                  bVar1 = std::operator==(bVar9,bVar10);
                  if (bVar1) {
                    pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                                       ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                                        (name._M_str + 0x30));
                    requireUInt32(this,pPVar6);
                  }
                  else {
                    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                      ((basic_string_view<char,_std::char_traits<char>_> *)local_c8)
                    ;
                    if (!bVar1) {
                      SVar7 = Token::range((Token *)(name._M_str + 0x10));
                      pDVar4 = addDiag(this,(DiagCode)0x2e0004,SVar7);
                      sVar8 = Token::valueText((Token *)&this_local);
                      pDVar4 = Diagnostic::operator<<(pDVar4,sVar8);
                      Diagnostic::operator<<(pDVar4,_local_c8);
                    }
                  }
                  goto LAB_00253677;
                }
              }
            }
          }
          pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                             ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                              (name._M_str + 0x30));
          if ((pPVar6->super_SyntaxNode).kind == SimplePragmaExpression) {
            pSVar3 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                                ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                                 (name._M_str + 0x30))->super_SyntaxNode;
            pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                               (pSVar3);
            if ((pSVar5->value).kind == StringLiteral) goto LAB_00253677;
          }
          pSVar3 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                              ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                               (name._M_str + 0x30))->super_SyntaxNode;
          SVar7 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
          pDVar4 = addDiag(this,(DiagCode)0x1f0004,SVar7);
          Diagnostic::operator<<(pDVar4,_local_c8);
        }
        else {
          SVar7 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
          pDVar4 = addDiag(this,(DiagCode)0x270004,SVar7);
          sVar8 = Token::valueText((Token *)&this_local);
          Diagnostic::operator<<(pDVar4,sVar8);
        }
LAB_00253677:
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
        ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                      *)&__end2.index);
      } while( true );
    }
  }
  if (args == (PragmaExpressionSyntax *)0x0) {
    local_48 = Token::range((Token *)&this_local);
  }
  else {
    local_48 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar4 = addDiag(this,(DiagCode)0x270004,local_48);
  sVar8 = Token::valueText((Token *)&this_local);
  Diagnostic::operator<<(pDVar4,sVar8);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}